

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<Tint>::vec(vec<Tint> *this,uint _sz,Tint *pad)

{
  int iVar1;
  Tint *pTVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->sz = _sz;
  this->cap = _sz;
  if (_sz == 0) {
    uVar4 = 0;
    pTVar2 = (Tint *)0x0;
  }
  else {
    uVar4 = (ulong)_sz;
    pTVar2 = (Tint *)malloc(uVar4 * 4);
  }
  this->data = pTVar2;
  iVar1 = pad->v;
  for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
    pTVar2[uVar3].v = iVar1;
  }
  return;
}

Assistant:

vec(unsigned int _sz, const T& pad) : sz(_sz), cap(sz) {
		data = sz != 0 ? (T*)malloc(cap * sizeof(T)) : nullptr;
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(pad);
		}
	}